

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

Am_Object get_selection_widget(Am_Value *v)

{
  bool bVar1;
  bool bVar2;
  Am_Value *test_value;
  Am_Value *pAVar3;
  Am_Value *in_RSI;
  Am_Value_List v_list;
  Am_Value_List AStack_38;
  
  bVar2 = Am_Value_List::Test(in_RSI);
  if (bVar2) {
    test_value = Am_Object::Get(&Am_Screen,499,0);
    Am_Value_List::Am_Value_List(&AStack_38,in_RSI);
    Am_Value_List::Start(&AStack_38);
    while( true ) {
      bVar2 = Am_Value_List::Last(&AStack_38);
      if (bVar2) break;
      pAVar3 = Am_Value_List::Get(&AStack_38);
      Am_Object::Am_Object((Am_Object *)v,pAVar3);
      bVar2 = Am_Object::Valid((Am_Object *)v);
      if (bVar2) {
        pAVar3 = Am_Object::Get((Am_Object *)v,0x1f1,0);
        bVar2 = Am_Value::operator==(pAVar3,test_value);
        if (!bVar2) goto LAB_002386d0;
        bVar2 = true;
        bVar1 = false;
      }
      else {
LAB_002386d0:
        bVar1 = true;
        bVar2 = false;
      }
      if (!bVar2) {
        Am_Object::~Am_Object((Am_Object *)v);
      }
      if (!bVar1) goto LAB_0023870c;
      Am_Value_List::Next(&AStack_38);
    }
    Am_Object::Am_Object((Am_Object *)v,&Am_No_Object);
LAB_0023870c:
    Am_Value_List::~Am_Value_List(&AStack_38);
  }
  else {
    Am_Object::Am_Object((Am_Object *)v,in_RSI);
  }
  return (Am_Object)(Am_Object_Data *)v;
}

Assistant:

static Am_Object
get_selection_widget(const Am_Value v)
{
  if (!(Am_Value_List::Test(v)))
    return v;
  else {
    const Am_Value& last_user = Am_Screen.Get(Am_LAST_USER_ID);
    Am_Value_List v_list = v;
    for (v_list.Start(); !v_list.Last(); v_list.Next()) {
      Am_Object item = v_list.Get();
      if (item.Valid() && item.Get(Am_USER_ID) == last_user)
        return item;
    }
    return Am_No_Object;
  }
}